

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMLSParserImpl::error
          (DOMLSParserImpl *this,uint code,XMLCh *param_2,ErrTypes errType,XMLCh *errorText,
          XMLCh *systemId,XMLCh *param_6,XMLFileLoc lineNum,XMLFileLoc colNum)

{
  bool bVar1;
  byte bVar2;
  DOMNode *errorNode;
  XMLScanner *pXVar3;
  XMLFilePos offset;
  uint *puVar4;
  undefined1 local_b8 [7];
  bool toContinueProcess;
  DOMErrorImpl domError;
  undefined1 local_78 [8];
  DOMLocatorImpl location;
  ErrorSeverity severity;
  XMLCh *systemId_local;
  XMLCh *errorText_local;
  ErrTypes errType_local;
  XMLCh *param_2_local;
  uint code_local;
  DOMLSParserImpl *this_local;
  
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    location.fURI._4_4_ = DOM_SEVERITY_ERROR;
    if (errType == ErrType_Warning) {
      location.fURI._4_4_ = DOM_SEVERITY_WARNING;
    }
    else if (errType == ErrType_Fatal) {
      location.fURI._4_4_ = DOM_SEVERITY_FATAL_ERROR;
    }
    errorNode = AbstractDOMParser::getCurrentNode(&this->super_AbstractDOMParser);
    DOMLocatorImpl::DOMLocatorImpl
              ((DOMLocatorImpl *)local_78,lineNum,colNum,errorNode,systemId,0xffffffffffffffff,
               0xffffffffffffffff);
    pXVar3 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
    bVar1 = XMLScanner::getCalculateSrcOfs(pXVar3);
    if (bVar1) {
      pXVar3 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      offset = XMLScanner::getSrcOffset(pXVar3);
      DOMLocatorImpl::setByteOffset((DOMLocatorImpl *)local_78,offset);
    }
    DOMErrorImpl::DOMErrorImpl
              ((DOMErrorImpl *)local_b8,location.fURI._4_4_,errorText,(DOMLocator *)local_78);
    bVar2 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,local_b8);
    if ((bVar2 & 1) == 0) {
      pXVar3 = AbstractDOMParser::getScanner(&this->super_AbstractDOMParser);
      bVar1 = XMLScanner::getInException(pXVar3);
      if (!bVar1) {
        puVar4 = (uint *)__cxa_allocate_exception(4);
        *puVar4 = code;
        __cxa_throw(puVar4,&XMLErrs::Codes::typeinfo,0);
      }
    }
    DOMErrorImpl::~DOMErrorImpl((DOMErrorImpl *)local_b8);
    DOMLocatorImpl::~DOMLocatorImpl((DOMLocatorImpl *)local_78);
  }
  return;
}

Assistant:

void DOMLSParserImpl::error( const   unsigned int                code
                            , const XMLCh* const
                            , const XMLErrorReporter::ErrTypes  errType
                            , const XMLCh* const                errorText
                            , const XMLCh* const                systemId
                            , const XMLCh* const
                            , const XMLFileLoc                  lineNum
                            , const XMLFileLoc                  colNum)
{
    if (fErrorHandler) {

        DOMError::ErrorSeverity severity = DOMError::DOM_SEVERITY_ERROR;

        if (errType == XMLErrorReporter::ErrType_Warning)
            severity = DOMError::DOM_SEVERITY_WARNING;
        else if (errType == XMLErrorReporter::ErrType_Fatal)
            severity = DOMError::DOM_SEVERITY_FATAL_ERROR;

        DOMLocatorImpl location(lineNum, colNum, getCurrentNode(), systemId);
        if(getScanner()->getCalculateSrcOfs())
            location.setByteOffset(getScanner()->getSrcOffset());
        DOMErrorImpl domError(severity, errorText, &location);

        // if user return false, we should stop the process, so throw an error
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess && !getScanner()->getInException())
            throw (XMLErrs::Codes) code;
    }
}